

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

int __thiscall
tetgenmesh::splitsegment
          (tetgenmesh *this,face *splitseg,point encpt,double rrp,point encpt1,point encpt2,
          int qflag,int chkencflag)

{
  bool bVar1;
  int iVar2;
  point pa;
  point pb;
  double dVar3;
  undefined1 local_1c0 [8];
  flipconstraints fc;
  undefined1 local_140 [4];
  int i;
  face neighseg;
  face neighsh;
  face spinsh_1;
  face parentsh_1;
  insertvertexflags ivf;
  point newpt;
  face searchsh;
  triface searchtet;
  face spinsh;
  face parentsh;
  int qflag_local;
  point encpt2_local;
  point encpt1_local;
  double rrp_local;
  point encpt_local;
  face *splitseg_local;
  tetgenmesh *this_local;
  
  if ((qflag == 0) && (bVar1 = smarktest3ed(this,splitseg), bVar1)) {
    return 0;
  }
  if (this->b->nobisect != 0) {
    if (this->checkconstraints == 0) {
      return 0;
    }
    dVar3 = areabound(this,splitseg);
    if ((dVar3 == 0.0) && (!NAN(dVar3))) {
      face::face((face *)&spinsh.shver);
      face::face((face *)&searchtet.ver);
      spivot(this,splitseg,(face *)&spinsh.shver);
      if (spinsh._8_8_ == 0) {
        return 0;
      }
      face::operator=((face *)&searchtet.ver,(face *)&spinsh.shver);
      do {
        dVar3 = areabound(this,(face *)&searchtet.ver);
        if (((dVar3 == 0.0) && (!NAN(dVar3))) ||
           (spivotself(this,(face *)&searchtet.ver), searchtet._8_8_ == spinsh._8_8_)) break;
      } while (searchtet._8_8_ != 0);
      if (searchtet._8_8_ != 0) {
        dVar3 = areabound(this,(face *)&searchtet.ver);
        if ((dVar3 != 0.0) || (NAN(dVar3))) goto LAB_0015e794;
      }
      return 0;
    }
  }
LAB_0015e794:
  triface::triface((triface *)&searchsh.shver);
  face::face((face *)&newpt);
  insertvertexflags::insertvertexflags((insertvertexflags *)&parentsh_1.shver);
  makepoint(this,&ivf.parentpt,FREESEGVERTEX);
  getsteinerptonsegment(this,splitseg,encpt,ivf.parentpt);
  if ((qflag == 0) && (this->b->cdtrefine == 0)) {
    face::face((face *)&spinsh_1.shver);
    spivot(this,splitseg,(face *)&spinsh_1.shver);
    if (spinsh_1._8_8_ != 0) {
      face::face((face *)&neighsh.shver);
      face::face((face *)&neighseg.shver);
      face::face((face *)local_140);
      face::operator=((face *)&neighsh.shver,(face *)&spinsh_1.shver);
      do {
        for (fc.remvert._4_4_ = 0; fc.remvert._4_4_ < 2; fc.remvert._4_4_ = fc.remvert._4_4_ + 1) {
          if (fc.remvert._4_4_ == 0) {
            senext(this,(face *)&neighsh.shver,(face *)&neighseg.shver);
          }
          else {
            senext2(this,(face *)&neighsh.shver,(face *)&neighseg.shver);
          }
          if (*(long *)(neighseg._8_8_ + (long)(((int)neighsh.sh >> 1) + 6) * 8) != 0) {
            sspivot(this,(face *)&neighseg.shver,(face *)local_140);
            pa = sorg(this,(face *)local_140);
            pb = sdest(this,(face *)local_140);
            iVar2 = checkseg4encroach(this,pa,pb,ivf.parentpt);
            if (iVar2 != 0) {
              pointdealloc(this,ivf.parentpt);
              return 0;
            }
          }
        }
        spivotself(this,(face *)&neighsh.shver);
      } while ((neighsh._8_8_ != 0) && (neighsh._8_8_ != spinsh_1._8_8_));
    }
  }
  sstpivot1(this,splitseg,(triface *)&searchsh.shver);
  parentsh_1.shver = 4;
  parentsh_1._12_4_ = 3;
  ivf.lawson = 1;
  ivf.iloc = 2;
  ivf.validflag = 0;
  if (this->b->metric != 0) {
    ivf.validflag = 4;
  }
  ivf.respectbdflag = chkencflag;
  ivf.cdtflag = 0xb;
  ivf.assignmeshsize = 3;
  ivf.bowywat = 1;
  ivf.splitbdflag = 1;
  ivf.chkencflag = this->b->metric;
  ivf.refinesh.shver = this->useinsertradius;
  iVar2 = insertpoint(this,ivf.parentpt,(triface *)&searchsh.shver,(face *)&newpt,splitseg,
                      (insertvertexflags *)&parentsh_1.shver);
  if (iVar2 == 0) {
    if (parentsh_1.shver == 9) {
      terminatetetgen(this,2);
    }
    pointdealloc(this,ivf.parentpt);
    smarktest3(this,splitseg);
    this_local._4_4_ = 0;
  }
  else {
    this->st_segref_count = this->st_segref_count + 1;
    if (0 < this->steinerleft) {
      this->steinerleft = this->steinerleft + -1;
    }
    if (this->useinsertradius != 0) {
      save_segmentpoint_insradius(this,ivf.parentpt,(point)ivf.smlen,(double)ivf._88_8_);
    }
    if (this->flipstack != (badface *)0x0) {
      flipconstraints::flipconstraints((flipconstraints *)local_1c0);
      local_1c0._4_4_ = chkencflag;
      local_1c0._0_4_ = 2;
      lawsonflip3d(this,(flipconstraints *)local_1c0);
      arraypool::restart(this->unflipqueue);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int tetgenmesh::splitsegment(face *splitseg, point encpt, REAL rrp, 
                             point encpt1, point encpt2, int qflag, 
                             int chkencflag)
{

  if (!qflag && smarktest3ed(*splitseg)) {
    // Do not try to re-split a marked segment.
    return 0;
  }

  if (b->nobisect) { // With -Y option.
    // Only split this segment if it is allowed to be split.
    if (checkconstraints) {
      // Check if it has a non-zero length bound. 
      if (areabound(*splitseg) == 0) {
        // It is not allowed.  However, if all of facets containing this seg
        //   is allowed to be split, we still split it.
        face parentsh, spinsh;
        //splitseg.shver = 0;
        spivot(*splitseg, parentsh);
        if (parentsh.sh == NULL) {
          return 0; // A dangling segment. Do not split it.
        }
        spinsh = parentsh;
        while (1) {
          if (areabound(spinsh) == 0) break;
          spivotself(spinsh);
          if (spinsh.sh == parentsh.sh) break;
		  if (spinsh.sh == NULL) break;  // It belongs to only one facet.
        }
        if ((!spinsh.sh) || (areabound(spinsh) == 0)) {
          // All facets at this seg are not allowed to be split.
          return 0;  // Do not split it.
        }
      }
    } else {
      return 0; // Do not split this segment.
    }
  } // if (b->nobisect)

  triface searchtet;
  face searchsh;
  point newpt;
  insertvertexflags ivf;

  makepoint(&newpt, FREESEGVERTEX);
  getsteinerptonsegment(splitseg, encpt, newpt);

  if (!qflag && !b->cdtrefine) {
    // Do not insert the point if it encroaches upon an adjacent segment.
    face parentsh;
    spivot(*splitseg, parentsh);
    if (parentsh.sh != NULL) {
      face spinsh, neighsh;
      face neighseg;
      spinsh = parentsh;
      while (1) {
        for (int i = 0; i < 2; i++) {
          if (i == 0) {
            senext(spinsh, neighsh);
          } else {
            senext2(spinsh, neighsh);
          }
          if (isshsubseg(neighsh)) {
            sspivot(neighsh, neighseg);
            if (checkseg4encroach(sorg(neighseg), sdest(neighseg), newpt)) {
              pointdealloc(newpt);
              return 0; // Do not split this segment.
            }
          }
        } // i
        spivotself(spinsh);
        if (spinsh.sh == NULL) break;
        if (spinsh.sh == parentsh.sh) break;
      } // while (1)
    }
  }

  // Split the segment by the Bowyer-Watson algorithm.
  sstpivot1(*splitseg, searchtet);
  ivf.iloc = (int) ONEDGE;
  ivf.bowywat = 3; // Use Bowyer-Watson, preserve subsegments and subfaces;
  ivf.validflag = 1; // Validate the B-W cavity.
  ivf.lawson = 2; // Do flips to recover Delaunayness.
  ivf.rejflag = 0;     // Do not check encroachment of new segments/facets.
  if (b->metric) {
    ivf.rejflag |= 4;  // Do check encroachment of protecting balls.
  }
  ivf.chkencflag = chkencflag;
  ivf.sloc = (int) INSTAR; // ivf.iloc;
  ivf.sbowywat = 3; // ivf.bowywat;  // Surface mesh options.
  ivf.splitbdflag = 1;
  ivf.respectbdflag = 1;
  ivf.assignmeshsize = b->metric;
  ivf.smlenflag = useinsertradius; // Return the closet mesh vertex.


  if (insertpoint(newpt, &searchtet, &searchsh, splitseg, &ivf)) {
    st_segref_count++;
    if (steinerleft > 0) steinerleft--;
    if (useinsertradius) {
      save_segmentpoint_insradius(newpt, ivf.parentpt, ivf.smlen);
    }
    if (flipstack != NULL) {
      flipconstraints fc;
      fc.chkencflag = chkencflag;
      fc.enqflag = 2;
      lawsonflip3d(&fc);
      unflipqueue->restart();
    }
    return 1;
  } else {
    // Point is not inserted.
    if (ivf.iloc == (int) NEARVERTEX) {
      terminatetetgen(this, 2);
    }
    pointdealloc(newpt);
    // Mark this segment to avoid splitting in the future.
	smarktest3(*splitseg);
    return 0;
  }
}